

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

void __thiscall kj::(anonymous_namespace)::AsyncStreamFd::tryPumpFrom(AsyncStreamFd *this)

{
  uint64_t in_RDX;
  long in_RSI;
  
  anon_unknown_0::AsyncStreamFd::tryPumpFrom
            ((AsyncStreamFd *)this,(AsyncInputStream *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(
      AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
#if __linux__ && !__ANDROID__
    KJ_IF_SOME(sock, kj::dynamicDowncastIfAvailable<AsyncStreamFd>(input)) {
      return pumpFromOther(sock, amount);
    }
#endif

#if __linux__
    KJ_IF_SOME(file, kj::dynamicDowncastIfAvailable<FileInputStream>(input)) {
      KJ_IF_SOME(fd, file.getUnderlyingFile().getFd()) {
        return pumpFromFile(file, fd, amount, 0);
      }
    }
#endif

    return kj::none;
  }